

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OldAccumulator.hpp
# Opt level: O2

void __thiscall OpenMD::PotVecAccumulator::PotVecAccumulator(PotVecAccumulator *this)

{
  (this->super_BaseAccumulator).Count_ = 0;
  (this->super_BaseAccumulator)._vptr_BaseAccumulator = (_func_int **)&PTR_clear_002bfe90;
  Vector<double,_7U>::Vector(&this->Val_);
  Vector<double,_7U>::Vector(&this->Avg_);
  Vector<double,_7U>::Vector(&this->Avg2_);
  Vector<double,_7U>::Vector(&this->Total_);
  (**(this->super_BaseAccumulator)._vptr_BaseAccumulator)(this);
  return;
}

Assistant:

PotVecAccumulator() : BaseAccumulator() { this->clear(); }